

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters.h
# Opt level: O3

void __thiscall
lwlog::details::date_formatter::format(date_formatter *this,string *pattern,record_base *record)

{
  size_type *psVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  uint32_t digit;
  ulong uVar7;
  undefined8 uVar8;
  long *local_100;
  ulong local_f8;
  long local_f0;
  undefined8 uStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  string local_80;
  string local_60;
  string local_40;
  long lVar3;
  
  iVar2 = (*record->_vptr_record_base[2])(record);
  lVar3 = CONCAT44(extraout_var,iVar2);
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_40,(datetime *)(ulong)*(ushort *)(lVar3 + 8),digit);
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_40,local_40._M_string_length,0,'\x01');
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_b0 = *puVar6;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar6;
    local_c0 = (ulong *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_60,(datetime *)(ulong)*(byte *)(lVar3 + 10),(uint32_t)local_b8);
  uVar7 = 0xf;
  if (local_c0 != &local_b0) {
    uVar7 = local_b0;
  }
  if (uVar7 < local_60._M_string_length + local_b8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar8 = local_60.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_60._M_string_length + local_b8) goto LAB_0010e241;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_0010e241:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_60._M_dataplus._M_p);
  }
  local_100 = &local_f0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_f0 = *plVar4;
    uStack_e8 = puVar5[3];
  }
  else {
    local_f0 = *plVar4;
    local_100 = (long *)*puVar5;
  }
  local_f8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_100,local_f8,0,'\x01');
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_90 = *puVar6;
    lStack_88 = plVar4[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar6;
    local_a0 = (ulong *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_80,(datetime *)(ulong)*(byte *)(lVar3 + 0xc),(uint32_t)local_98);
  uVar7 = 0xf;
  if (local_a0 != &local_90) {
    uVar7 = local_90;
  }
  if (uVar7 < local_80._M_string_length + local_98) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar8 = local_80.field_2._M_allocated_capacity;
    }
    if (local_80._M_string_length + local_98 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0010e388;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
LAB_0010e388:
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_e0.field_2._M_allocated_capacity = *psVar1;
    local_e0.field_2._8_8_ = puVar5[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar1;
    local_e0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_e0._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  formatter::format_attribute<std::__cxx11::string>(pattern,(flag_pair *)flag::date,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void format(std::string& pattern, const record_base& record) const override
		{
			const auto& time_point{ record.time_point() };

			formatter::format_attribute(
				pattern,
				flag::date,
				os::datetime::ensure_two_digit_format(time_point.year)
					+ '-' + os::datetime::ensure_two_digit_format(time_point.month)
					+ '-' + os::datetime::ensure_two_digit_format(time_point.day)
			);
		}